

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitIteratorTopLevelCatch
               (ByteCodeLabel catchLabel,RegSlot iteratorLocation,RegSlot shouldCallReturnLocation,
               RegSlot shouldCallReturnLocationFinally,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,bool isAsync)

{
  ByteCodeWriter *this;
  ByteCodeLabel labelID;
  RegSlot R0;
  ByteCodeLabel labelID_00;
  
  this = &byteCodeGenerator->m_writer;
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::Empty(this,Leave);
  Js::ByteCodeWriter::Br(this,labelID);
  Js::ByteCodeWriter::MarkLabel(this,catchLabel);
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  Js::ByteCodeWriter::Reg1(this,Catch,R0);
  ByteCodeGenerator::PushJumpCleanupForTry(byteCodeGenerator,ResumeCatch,0,0xffffffff,0xffffffff);
  labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::BrReg1(this,BrFalse_A,labelID_00,shouldCallReturnLocation);
  Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnLocationFinally);
  EmitTryCatchAroundIteratorClose(iteratorLocation,labelID_00,byteCodeGenerator,funcInfo,isAsync);
  Js::ByteCodeWriter::MarkLabel(this,labelID_00);
  Js::ByteCodeWriter::Reg1(this,Throw,R0);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(this,Leave);
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  return;
}

Assistant:

void EmitIteratorTopLevelCatch(
    Js::ByteCodeLabel catchLabel,
    Js::RegSlot iteratorLocation,
    Js::RegSlot shouldCallReturnLocation,
    Js::RegSlot shouldCallReturnLocationFinally,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync)
{
    Js::ByteCodeLabel afterCatchBlockLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
    byteCodeGenerator->Writer()->Br(afterCatchBlockLabel);
    byteCodeGenerator->Writer()->MarkLabel(catchLabel);

    Js::RegSlot catchParamLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::Catch, catchParamLocation);

    byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::ResumeCatch);

    Js::ByteCodeLabel skipCallCloseLabel = byteCodeGenerator->Writer()->DefineLabel();

    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, skipCallCloseLabel, shouldCallReturnLocation);
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnLocationFinally);

    EmitTryCatchAroundIteratorClose(iteratorLocation, skipCallCloseLabel, byteCodeGenerator, funcInfo, isAsync);

    byteCodeGenerator->Writer()->MarkLabel(skipCallCloseLabel);

    // Rethrow the exception
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::Throw, catchParamLocation);
    funcInfo->ReleaseTmpRegister(catchParamLocation);

    byteCodeGenerator->PopJumpCleanup();
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
    byteCodeGenerator->Writer()->MarkLabel(afterCatchBlockLabel);
}